

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

ion_err_t dictionary_close(ion_dictionary_t *dictionary)

{
  int key_size_00;
  int value_size_00;
  ion_key_type_t key_type_00;
  ion_dictionary_id_t id;
  code *pcVar1;
  undefined1 *key;
  ion_key_t value;
  ion_value_t pvVar2;
  ion_err_t iVar3;
  undefined1 *puVar4;
  undefined8 uStack_100;
  ion_dictionary_size_t aiStack_f8 [2];
  undefined8 uStack_f0;
  undefined1 auStack_e8 [11];
  bool local_dd;
  ion_status_t local_dc;
  ion_status_t status;
  ion_cursor_status_t cursor_status;
  ion_dictionary_t fallback_dict;
  ion_dictionary_handler_t fallback_handler;
  ion_key_type_t key_type;
  int value_size;
  int key_size;
  ion_err_t err;
  ion_record_t record;
  ion_dict_cursor_t *cursor;
  ion_predicate_t predicate;
  ion_err_t error;
  ion_dictionary_t *dictionary_local;
  
  if (dictionary->status == '\x01') {
    dictionary_local._7_1_ = '\0';
  }
  else {
    uStack_f0 = 0x10e09a;
    predicate.destroy._7_1_ = (*dictionary->handler->close_dictionary)(dictionary);
    if (predicate.destroy._7_1_ == '\x0f') {
      record.value = (ion_value_t)0x0;
      uStack_f0 = 0x10e0c6;
      dictionary_build_predicate((ion_predicate_t *)&cursor,'\x02');
      uStack_f0 = 0x10e0d7;
      dictionary_local._7_1_ =
           dictionary_find(dictionary,(ion_predicate_t *)&cursor,(ion_dict_cursor_t **)&record.value
                          );
      if (dictionary_local._7_1_ == '\0') {
        key_size_00 = (dictionary->instance->record).key_size;
        value_size_00 = (dictionary->instance->record).value_size;
        key_type_00 = dictionary->instance->key_type;
        _key_size = auStack_e8 + -((long)key_size_00 + 0xfU & 0xfffffffffffffff0);
        puVar4 = _key_size + -((long)value_size_00 + 0xfU & 0xfffffffffffffff0);
        record.key = puVar4;
        *(undefined8 *)(puVar4 + -8) = 0x10e156;
        ffdict_init((ion_dictionary_handler_t *)&fallback_dict.handler);
        id = dictionary->instance->id;
        *(undefined4 *)(puVar4 + -0x10) = 1;
        *(undefined8 *)(puVar4 + -0x18) = 0x10e18a;
        dictionary_local._7_1_ =
             dictionary_create((ion_dictionary_handler_t *)&fallback_dict.handler,
                               (ion_dictionary_t *)&status.count,id,key_type_00,key_size_00,
                               value_size_00,*(ion_dictionary_size_t *)(puVar4 + -0x10));
        if (dictionary_local._7_1_ == '\0') {
          do {
            pvVar2 = record.value;
            pcVar1 = *(code **)((long)record.value + 0x18);
            *(undefined8 *)(puVar4 + -8) = 0x10e1ba;
            status._3_1_ = (*pcVar1)(pvVar2,&key_size);
            value = record.key;
            key = _key_size;
            local_dd = status._3_1_ == '\x04' || status._3_1_ == '\x02';
            if (status._3_1_ != '\x04' && status._3_1_ != '\x02') {
              if ((status._3_1_ != '\x01') && (status._3_1_ != '\x03')) {
                return '\x12';
              }
              pcVar1 = *(code **)((long)record.value + 0x20);
              *(undefined8 *)(puVar4 + -8) = 0x10e27a;
              (*pcVar1)(&record.value);
              *(undefined8 *)(puVar4 + -8) = 0x10e286;
              iVar3 = dictionary_close((ion_dictionary_t *)&status.count);
              if (iVar3 != '\0') {
                return iVar3;
              }
              *(undefined8 *)(puVar4 + -8) = 0x10e2a4;
              iVar3 = dictionary_delete_dictionary(dictionary);
              if (iVar3 != '\0') {
                return iVar3;
              }
              predicate.destroy._7_1_ = '\0';
              goto LAB_0010e2bd;
            }
            *(undefined8 *)(puVar4 + -8) = 0x10e20b;
            local_dc = dictionary_insert((ion_dictionary_t *)&status.count,key,value);
          } while (local_dc.error == '\0');
          pcVar1 = *(code **)((long)record.value + 0x20);
          *(undefined8 *)(puVar4 + -8) = 0x10e22a;
          (*pcVar1)(&record.value);
          *(undefined8 *)(puVar4 + -8) = 0x10e236;
          dictionary_delete_dictionary((ion_dictionary_t *)&status.count);
          dictionary_local._7_1_ = local_dc.error;
        }
      }
    }
    else {
LAB_0010e2bd:
      if (predicate.destroy._7_1_ == '\0') {
        dictionary->status = '\x01';
      }
      dictionary_local._7_1_ = predicate.destroy._7_1_;
    }
  }
  return dictionary_local._7_1_;
}

Assistant:

ion_err_t
dictionary_close(
	ion_dictionary_t *dictionary
) {
	if (ion_dictionary_status_closed == dictionary->status) {
		return err_ok;
	}

	ion_err_t error = dictionary->handler->close_dictionary(dictionary);

	if (err_not_implemented == error) {
		ion_predicate_t		predicate;
		ion_dict_cursor_t	*cursor = NULL;
		ion_record_t		record;
		ion_err_t			err;

		dictionary_build_predicate(&predicate, predicate_all_records);
		err = dictionary_find(dictionary, &predicate, &cursor);

		if (err_ok != err) {
			return err;
		}

		int				key_size	= dictionary->instance->record.key_size;
		int				value_size	= dictionary->instance->record.value_size;
		ion_key_type_t	key_type	= dictionary->instance->key_type;

		record.key		= alloca(key_size);
		record.value	= alloca(value_size);

		ion_dictionary_handler_t	fallback_handler;
		ion_dictionary_t			fallback_dict;

		ffdict_init(&fallback_handler);

		err = dictionary_create(&fallback_handler, &fallback_dict, dictionary->instance->id, key_type, key_size, value_size, 1);

		if (err_ok != err) {
			return err;
		}

		ion_cursor_status_t cursor_status;

		while (cs_cursor_active == (cursor_status = cursor->next(cursor, &record)) || cs_cursor_initialized == cursor_status) {
			ion_status_t status = dictionary_insert(&fallback_dict, record.key, record.value);

			if (err_ok != status.error) {
				cursor->destroy(&cursor);
				dictionary_delete_dictionary(&fallback_dict);
				return status.error;
			}
		}

		/* Cursor has either reached the end of the result set or there was no
		   result set to traverse, and the cursor remains uninitialized. */
		if ((cs_end_of_results != cursor_status) && (cs_cursor_uninitialized != cursor_status)) {
			return err_uninitialized;
		}

		cursor->destroy(&cursor);

		err = dictionary_close(&fallback_dict);

		if (err_ok != err) {
			return err;
		}

		err = dictionary_delete_dictionary(dictionary);

		if (err_ok != err) {
			return err;
		}

		error = err_ok;
	}

	if (err_ok == error) {
		dictionary->status = ion_dictionary_status_closed;
	}

	return error;
}